

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O2

void __thiscall
soul::SanityCheckPass::PostResolutionChecks::visit(PostResolutionChecks *this,UnaryOperator *u)

{
  Op op;
  Expression *pEVar1;
  bool bVar2;
  Type TStack_68;
  CompileMessage local_50;
  
  (*(this->super_ASTVisitor)._vptr_ASTVisitor[3])(this,(u->source).object);
  op = u->operation;
  (*(((u->source).object)->super_Statement).super_ASTObject._vptr_ASTObject[4])(&TStack_68);
  bVar2 = UnaryOp::isTypeSuitable(op,&TStack_68);
  RefCountedPtr<soul::Structure>::~RefCountedPtr(&TStack_68.structure);
  if (bVar2) {
    return;
  }
  pEVar1 = (u->source).object;
  Errors::wrongTypeForUnary<>();
  AST::Context::throwError(&(pEVar1->super_Statement).super_ASTObject.context,&local_50,false);
}

Assistant:

void visit (AST::UnaryOperator& u) override
        {
            super::visit (u);

            if (! UnaryOp::isTypeSuitable (u.operation, u.source->getResultType()))
                u.source->context.throwError (Errors::wrongTypeForUnary());
        }